

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::lookingAtDecimal(SelectionCompiler *this,bool param_1)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  
  uVar1 = this->ichToken;
  uVar2 = this->cchScript;
  if (uVar1 != uVar2) {
    pcVar3 = (this->script)._M_dataplus._M_p;
    uVar6 = (pcVar3[(int)uVar1] == '-') + uVar1;
    lVar9 = (long)(int)uVar6;
    uVar4 = uVar6;
    if ((int)uVar6 < (int)uVar2) {
      uVar4 = uVar2;
    }
    iVar8 = 0x58;
    bVar10 = false;
    for (; cVar7 = (char)iVar8, uVar5 = uVar4, lVar9 < (int)uVar2; lVar9 = lVar9 + 1) {
      cVar7 = pcVar3[lVar9];
      iVar8 = (int)cVar7;
      uVar5 = uVar6;
      if (9 < iVar8 - 0x30U) break;
      uVar6 = uVar6 + 1;
      bVar10 = true;
    }
    uVar12 = (ulong)uVar5;
    if (uVar5 == uVar2) {
      return false;
    }
    if (cVar7 != '.') {
      return false;
    }
    if (((int)uVar5 < 1) || (iVar8 = isalpha((int)pcVar3[uVar12 - 1]), iVar8 == 0)) {
      lVar9 = (long)(int)uVar5;
      uVar4 = uVar5 + 1;
      if ((int)(uVar5 + 1) < (int)uVar2) {
        uVar4 = uVar2;
      }
      do {
        bVar11 = bVar10;
        lVar9 = lVar9 + 1;
        uVar6 = uVar4;
        if ((int)uVar2 <= lVar9) break;
        uVar6 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar6;
        bVar10 = true;
      } while ((int)pcVar3[lVar9] - 0x30U < 10);
      this->cchToken = uVar6 - uVar1;
      return bVar11;
    }
  }
  return false;
}

Assistant:

bool SelectionCompiler::lookingAtDecimal(bool) {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    if (script[ichT] == '-') { ++ichT; }
    bool digitSeen = false;
    char ch        = 'X';
    while (ichT < cchScript && std::isdigit(ch = script[ichT])) {
      ++ichT;
      digitSeen = true;
    }

    if (ichT == cchScript || ch != '.') { return false; }

    // to support DMPC.1, let's check the character before the dot
    if (ch == '.' && (ichT > 0) && std::isalpha(script[ichT - 1])) {
      return false;
    }

    ++ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
      digitSeen = true;
    }
    cchToken = ichT - ichToken;
    return digitSeen;
  }